

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O0

int disassemble_instr(u8 *data,char *buffer,size_t size)

{
  byte bVar1;
  byte bVar2;
  char local_98 [8];
  char hex [3] [3];
  char *mnemonic;
  char local_78 [6];
  u8 num_bytes;
  u8 opcode;
  char temp [80];
  size_t size_local;
  char *buffer_local;
  u8 *data_local;
  
  bVar1 = *data;
  bVar2 = s_opcode_bytes[bVar1];
  if (bVar2 == 1) {
    unique0x00012000 = s_opcode_mnemonic[bVar1];
    if (unique0x00012000 == (char *)0x0) {
      stack0xffffffffffffff78 = "*INVALID*";
    }
    strncpy(local_78,stack0xffffffffffffff78,0x4f);
  }
  else if (bVar2 == 2) {
    if (bVar1 == 0xcb) {
      strncpy(local_78,s_cb_opcode_mnemonic[data[1]],0x4f);
    }
    else {
      snprintf(local_78,0x50,s_opcode_mnemonic[bVar1],(ulong)data[1]);
    }
  }
  else {
    if (bVar2 != 3) {
      __assert_fail("!\"invalid opcode byte length.\\n\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator-debug.c"
                    ,0x146,"int disassemble_instr(u8 *, char *, size_t)");
    }
    snprintf(local_78,0x50,s_opcode_mnemonic[bVar1],(ulong)*(ushort *)(data + 1));
  }
  local_98[0] = ' ';
  local_98[1] = ' ';
  local_98[2] = '\0';
  local_98[3] = ' ';
  local_98[4] = ' ';
  local_98[5] = '\0';
  local_98[6] = ' ';
  local_98[7] = ' ';
  hex[0][0] = '\0';
  if (bVar2 != 1) {
    if (bVar2 != 2) {
      if (bVar2 != 3) goto LAB_001d9429;
      sprint_hex(local_98 + 6,data[2]);
    }
    sprint_hex(local_98 + 3,data[1]);
  }
  sprint_hex(local_98,*data);
LAB_001d9429:
  snprintf(buffer,size,"%s %s %s  %-15s",local_98,local_98 + 3,local_98 + 6,local_78);
  return (int)bVar2;
}

Assistant:

static int disassemble_instr(u8 data[3], char* buffer, size_t size) {
  char temp[80];
  u8 opcode = data[0];
  u8 num_bytes = s_opcode_bytes[opcode];
  switch (num_bytes) {
    case 1: {
      const char* mnemonic = s_opcode_mnemonic[opcode];
      if (!mnemonic) {
        mnemonic = "*INVALID*";
      }
      strncpy(temp, mnemonic, sizeof(temp) - 1);
      break;
    }
    case 2:
      if (opcode == 0xcb) {
        strncpy(temp, s_cb_opcode_mnemonic[data[1]], sizeof(temp) - 1);
      } else {
        snprintf(temp, sizeof(temp), s_opcode_mnemonic[opcode], data[1]);
      }
      break;
    case 3:
      snprintf(temp, sizeof(temp), s_opcode_mnemonic[opcode],
               (data[2] << 8) | data[1]);
      break;
    default: assert(!"invalid opcode byte length.\n"); break;
  }

  char hex[][3] = {"  ", "  ", "  "};
  switch (num_bytes) {
    case 3: sprint_hex(hex[2], data[2]); /* Fallthrough. */
    case 2: sprint_hex(hex[1], data[1]); /* Fallthrough. */
    case 1: sprint_hex(hex[0], data[0]); break;
  }

  snprintf(buffer, size, "%s %s %s  %-15s", hex[0], hex[1], hex[2], temp);
  return num_bytes;
}